

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestRequiredEnumMulti::_InternalSerialize
          (TestRequiredEnumMulti *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  anon_union_24_1_493b367e_for_TestRequiredEnumMulti_11 aVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  aVar2 = this->field_0;
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x8) != (undefined1  [24])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.required_enum_1_;
    pbVar4 = target + 1;
    *target = '\b';
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.required_enum_2_;
    pbVar4 = target + 1;
    *target = 0x10;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>
                       (stream,(this->field_0)._impl_.a_3_,target);
  }
  if (((undefined1  [24])aVar2 & (undefined1  [24])0x4) != (undefined1  [24])0x0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar5 = (ulong)(this->field_0)._impl_.required_enum_4_;
    pbVar4 = target + 1;
    *target = 0x20;
    uVar6 = uVar5;
    if (0x7f < uVar5) {
      do {
        *pbVar4 = (byte)uVar6 | 0x80;
        uVar5 = uVar6 >> 7;
        pbVar4 = pbVar4 + 1;
        bVar1 = 0x3fff < uVar6;
        uVar6 = uVar5;
      } while (bVar1);
    }
    *pbVar4 = (byte)uVar5;
    target = pbVar4 + 1;
  }
  uVar6 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar6 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar3;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestRequiredEnumMulti::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestRequiredEnumMulti& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestRequiredEnumMulti)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .proto2_unittest.ForeignEnum required_enum_1 = 1 [features = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_required_enum_1(), target);
  }

  // .proto2_unittest.TestRequiredEnumMulti.NestedEnum required_enum_2 = 2 [features = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_required_enum_2(), target);
  }

  // int32 a_3 = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<3>(
            stream, this_._internal_a_3(), target);
  }

  // .proto2_unittest.TestRequiredEnumMulti.NestedEnum required_enum_4 = 4 [features = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_required_enum_4(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestRequiredEnumMulti)
  return target;
}